

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfig.cpp
# Opt level: O2

void __thiscall
SoundConfig::writeSettings(SoundConfig *this,QSettings *settings,AudioEnumerator *enumerator)

{
  int iVar1;
  QString api;
  anon_union_24_3_e3d07ef4_for_data local_58;
  QArrayDataPointer<char16_t> local_38;
  
  QSettings::beginGroup((QString *)settings);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  QSettings::remove((QString *)settings);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  local_38.size = 0;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  if (this->mBackendIndex != -1) {
    AudioEnumerator::backendNames((QStringList *)&local_58,enumerator);
    QString::operator=((QString *)&local_38,
                       (QString *)((long)this->mBackendIndex * 0x18 + local_58._8_8_));
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
  }
  QVariant::QVariant((QVariant *)&local_58,(QString *)&local_38);
  QSettings::setValue((QString *)settings,(QVariant *)&Keys::api);
  QVariant::~QVariant((QVariant *)&local_58);
  AudioEnumerator::serializeDevice
            ((QVariant *)&local_58,enumerator,this->mBackendIndex,this->mDeviceIndex);
  QSettings::setValue((QString *)settings,(QVariant *)&Keys::deviceId);
  QVariant::~QVariant((QVariant *)&local_58);
  iVar1 = samplerate(this);
  QVariant::QVariant((QVariant *)&local_58,iVar1);
  QSettings::setValue((QString *)settings,(QVariant *)&Keys::samplerate);
  QVariant::~QVariant((QVariant *)&local_58);
  QVariant::QVariant((QVariant *)&local_58,this->mLatency);
  QSettings::setValue((QString *)settings,(QVariant *)&Keys::latency);
  QVariant::~QVariant((QVariant *)&local_58);
  QVariant::QVariant((QVariant *)&local_58,this->mPeriod);
  QSettings::setValue((QString *)settings,(QVariant *)&Keys::period);
  QVariant::~QVariant((QVariant *)&local_58);
  QSettings::endGroup();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  return;
}

Assistant:

void SoundConfig::writeSettings(QSettings &settings, AudioEnumerator const& enumerator) const {
    settings.beginGroup(Keys::Sound);
    settings.remove(QString());

    QString api;
    // backend index is -1 when there are no available backends
    // which shouldn't be possible since the ma_backend_null is always enabled
    if (mBackendIndex != -1) {
        api = enumerator.backendNames().at(mBackendIndex);
    }

    settings.setValue(Keys::api, api);
    settings.setValue(Keys::deviceId, enumerator.serializeDevice(mBackendIndex, mDeviceIndex));
    settings.setValue(Keys::samplerate, samplerate());
    settings.setValue(Keys::latency, mLatency);
    settings.setValue(Keys::period, mPeriod);

    settings.endGroup();
}